

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nodes-common.cc
# Opt level: O2

Dim * __thiscall
cnn::InnerProduct3D_1D::dim_forward
          (Dim *__return_storage_ptr__,InnerProduct3D_1D *this,
          vector<cnn::Dim,_std::allocator<cnn::Dim>_> *xs)

{
  pointer pDVar1;
  uint uVar2;
  bool bVar3;
  long lVar4;
  ostream *poVar5;
  invalid_argument *piVar6;
  initializer_list<unsigned_int> x;
  string local_1b0 [32];
  ostringstream s;
  
  pDVar1 = (xs->super__Vector_base<cnn::Dim,_std::allocator<cnn::Dim>_>)._M_impl.
           super__Vector_impl_data._M_start;
  lVar4 = (long)(xs->super__Vector_base<cnn::Dim,_std::allocator<cnn::Dim>_>)._M_impl.
                super__Vector_impl_data._M_finish - (long)pDVar1;
  if ((lVar4 / 0x24 & 0xfffffffffffffffeU) != 2) {
    piVar6 = (invalid_argument *)__cxa_allocate_exception(0x10,0x24,lVar4 % 0x24);
    std::invalid_argument::invalid_argument
              (piVar6,"Expected two or three arguments in InnerProduct3D_1D");
    __cxa_throw(piVar6,&std::invalid_argument::typeinfo,std::invalid_argument::~invalid_argument);
  }
  if (((pDVar1->nd == 3) && (pDVar1[1].nd == 1)) && (pDVar1->d[2] == pDVar1[1].d[0])) {
    _s = *(undefined8 *)pDVar1->d;
    uVar2 = pDVar1[1].bd;
    if (pDVar1[1].bd < pDVar1->bd) {
      uVar2 = pDVar1->bd;
    }
    x._M_len = 2;
    x._M_array = (iterator)&s;
    Dim::Dim(__return_storage_ptr__,x,uVar2);
    pDVar1 = (xs->super__Vector_base<cnn::Dim,_std::allocator<cnn::Dim>_>)._M_impl.
             super__Vector_impl_data._M_start;
    if ((long)(xs->super__Vector_base<cnn::Dim,_std::allocator<cnn::Dim>_>)._M_impl.
              super__Vector_impl_data._M_finish - (long)pDVar1 == 0x6c) {
      uVar2 = pDVar1[2].bd;
      if (pDVar1[2].bd < __return_storage_ptr__->bd) {
        uVar2 = __return_storage_ptr__->bd;
      }
      __return_storage_ptr__->bd = uVar2;
      bVar3 = operator!=(pDVar1 + 2,__return_storage_ptr__);
      if (bVar3) {
        std::__cxx11::ostringstream::ostringstream((ostringstream *)&s);
        poVar5 = std::operator<<((ostream *)&s,"Bad input dimensions in InnerProduct3D_1D: ");
        operator<<(poVar5,xs);
        piVar6 = (invalid_argument *)__cxa_allocate_exception(0x10);
        std::__cxx11::stringbuf::str();
        std::invalid_argument::invalid_argument(piVar6,local_1b0);
        __cxa_throw(piVar6,&std::invalid_argument::typeinfo,std::invalid_argument::~invalid_argument
                   );
      }
    }
    return __return_storage_ptr__;
  }
  std::__cxx11::ostringstream::ostringstream((ostringstream *)&s);
  poVar5 = std::operator<<((ostream *)&s,"Bad input dimensions in InnerProduct3D_1D: ");
  operator<<(poVar5,xs);
  piVar6 = (invalid_argument *)__cxa_allocate_exception(0x10);
  std::__cxx11::stringbuf::str();
  std::invalid_argument::invalid_argument(piVar6,local_1b0);
  __cxa_throw(piVar6,&std::invalid_argument::typeinfo,std::invalid_argument::~invalid_argument);
}

Assistant:

Dim InnerProduct3D_1D::dim_forward(const vector<Dim>& xs) const {
  if (xs.size() != 2 && xs.size() != 3)
    throw std::invalid_argument("Expected two or three arguments in InnerProduct3D_1D");
  if (xs[0].ndims() != 3 ||
      xs[1].ndims() != 1 ||
      xs[0].size(2) != xs[1].size(0)) {
    ostringstream s; s << "Bad input dimensions in InnerProduct3D_1D: " << xs;
    throw std::invalid_argument(s.str());
  }
  Dim d({xs[0].size(0), xs[0].size(1)}, max(xs[0].bd, xs[1].bd));
  if(xs.size() == 3) d.bd = max(d.bd, xs[2].bd);
  if (xs.size() == 3 && xs[2] != d) {
    ostringstream s; s << "Bad input dimensions in InnerProduct3D_1D: " << xs;
    throw std::invalid_argument(s.str());
  }
  return d;
}